

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O2

WJTL_STATUS TestBools(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  
  WVar1 = VerifyOutputBool(false,"false");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputBool( 0, \"false\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestBools",0xbd);
  WVar2 = VerifyOutputBool(true,"true");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputBool( 1, \"true\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestBools",0xbe);
  WVar3 = WJTL_STATUS_FAILED;
  if (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS) {
    WVar3 = WJTL_STATUS_SUCCESS;
  }
  return WVar3;
}

Assistant:

static
WJTL_STATUS
    TestBools
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test valid bools
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsBool( IsJson5, "false", false ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsBool( IsJson5, "true", true ) );

    // Test invalid bools
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "TRUE", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " FALSE", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " yes", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " no", 1 ) );

    return TestReturn;
}